

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_mac.c
# Opt level: O0

char * Qiniu_Mac_Sign(Qiniu_Mac *self,char *data)

{
  size_t sVar1;
  Qiniu_HMAC *self_00;
  char *pcVar2;
  char *pcVar3;
  Qiniu_HMAC *hmac;
  Qiniu_Mac mac;
  size_t digest_len;
  char digest [65];
  char *encoded_digest;
  char *sign;
  char *data_local;
  Qiniu_Mac *self_local;
  
  mac.secretKey = (char *)0x41;
  if (self == (Qiniu_Mac *)0x0) {
    hmac = (Qiniu_HMAC *)QINIU_ACCESS_KEY;
    mac.accessKey = QINIU_SECRET_KEY;
  }
  else {
    hmac = (Qiniu_HMAC *)self->accessKey;
    mac.accessKey = self->secretKey;
  }
  pcVar2 = mac.accessKey;
  sVar1 = strlen(mac.accessKey);
  self_00 = Qiniu_HMAC_New(QINIU_DIGEST_TYPE_SHA1,(uchar *)pcVar2,(int)sVar1);
  sVar1 = strlen(data);
  Qiniu_HMAC_Update(self_00,data,(int)sVar1);
  Qiniu_HMAC_Final(self_00,(uchar *)&digest_len,(size_t *)&mac.secretKey);
  Qiniu_HMAC_Free(self_00);
  pcVar2 = Qiniu_Memory_Encode((char *)&digest_len,(size_t)mac.secretKey);
  pcVar3 = Qiniu_String_Concat3((char *)hmac,":",pcVar2);
  Qiniu_Free(pcVar2);
  return pcVar3;
}

Assistant:

char *Qiniu_Mac_Sign(Qiniu_Mac *self, char *data)
{
	char *sign;
	char *encoded_digest;
	char digest[EVP_MAX_MD_SIZE + 1];
	size_t digest_len = sizeof(digest);

	Qiniu_Mac mac;

	if (self)
	{
		mac = *self;
	}
	else
	{
		mac.accessKey = QINIU_ACCESS_KEY;
		mac.secretKey = QINIU_SECRET_KEY;
	}

	Qiniu_HMAC *hmac = Qiniu_HMAC_New(QINIU_DIGEST_TYPE_SHA1, (const unsigned char *)mac.secretKey, (int)strlen(mac.secretKey));
	Qiniu_HMAC_Update(hmac, (const unsigned char *)data, (int)strlen(data));
	Qiniu_HMAC_Final(hmac, (unsigned char *)digest, &digest_len);
	Qiniu_HMAC_Free(hmac);

	encoded_digest = Qiniu_Memory_Encode(digest, digest_len);
	sign = Qiniu_String_Concat3(mac.accessKey, ":", encoded_digest);
	Qiniu_Free(encoded_digest);

	return sign;
}